

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

int elf_fetch_backward_init(uchar **ppin,uchar *pinend,uint64_t *pval,uint *pbits)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  byte *pbVar7;
  
  pbVar3 = *ppin;
  bVar1 = *pbVar3;
  if (bVar1 == 0) {
    iVar2 = 0;
  }
  else {
    if (((ulong)pbVar3 & 3) == 0) {
      uVar4 = 8;
      uVar5 = 0;
      bVar6 = bVar1;
    }
    else {
      iVar2 = (int)pbVar3;
      uVar5 = 0;
      pbVar7 = pbVar3;
      do {
        pbVar7 = pbVar7 + -1;
        uVar5 = (ulong)*pbVar3 | uVar5 << 8;
        pbVar3 = pbVar3 + -1;
      } while (((ulong)pbVar7 & 3) != 0);
      bVar6 = *pbVar3;
      uVar5 = uVar5 << 8;
      uVar4 = (iVar2 * 8 + 0x18U & 0x18) + 0x10;
    }
    *ppin = pbVar3;
    *pval = bVar6 | uVar5;
    *pbits = uVar4;
    elf_fetch_bits_backward(ppin,pinend,pval,pbits);
    uVar4 = 0x1f;
    if (bVar1 != 0) {
      for (; bVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    *pbits = (*pbits - (uVar4 ^ 0x1f)) + 0x17;
    elf_fetch_bits_backward(ppin,pinend,pval,pbits);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
elf_fetch_backward_init (const unsigned char **ppin,
			 const unsigned char *pinend,
			 uint64_t *pval, unsigned int *pbits)
{
  const unsigned char *pin;
  unsigned int stream_start;
  uint64_t val;
  unsigned int bits;

  pin = *ppin;
  stream_start = (unsigned int)*pin;
  if (unlikely (stream_start == 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  val = 0;
  bits = 0;

  /* Align to a 32-bit boundary.  */
  while ((((uintptr_t)pin) & 3) != 0)
    {
      val <<= 8;
      val |= (uint64_t)*pin;
      bits += 8;
      --pin;
    }

  val <<= 8;
  val |= (uint64_t)*pin;
  bits += 8;

  *ppin = pin;
  *pval = val;
  *pbits = bits;
  if (!elf_fetch_bits_backward (ppin, pinend, pval, pbits))
    return 0;

  *pbits -= __builtin_clz (stream_start) - (sizeof (unsigned int) - 1) * 8 + 1;

  if (!elf_fetch_bits_backward (ppin, pinend, pval, pbits))
    return 0;

  return 1;
}